

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int derive_secret_with_hash(ptls_key_schedule_t *sched,void *secret,char *label,uint8_t *hash)

{
  int iVar1;
  void *in_RCX;
  long in_RDI;
  int ret;
  char *in_stack_00000088;
  size_t in_stack_00000090;
  void *in_stack_00000098;
  ptls_hash_algorithm_t *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  undefined1 in_stack_000000c0 [16];
  char *in_stack_000000d0;
  
  ptls_iovec_init((void *)(in_RDI + 0x10),*(size_t *)(*(long *)(in_RDI + 0x58) + 8));
  ptls_iovec_init(in_RCX,*(size_t *)(*(long *)(in_RDI + 0x58) + 8));
  iVar1 = hkdf_expand_label(in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                            (ptls_iovec_t)in_stack_000000a8,in_stack_00000088,
                            (ptls_iovec_t)in_stack_000000c0,in_stack_000000d0);
  return iVar1;
}

Assistant:

static int derive_secret_with_hash(ptls_key_schedule_t *sched, void *secret, const char *label, const uint8_t *hash)
{
    int ret = hkdf_expand_label(sched->hashes[0].algo, secret, sched->hashes[0].algo->digest_size,
                                ptls_iovec_init(sched->secret, sched->hashes[0].algo->digest_size), label,
                                ptls_iovec_init(hash, sched->hashes[0].algo->digest_size), sched->hkdf_label_prefix);
    PTLS_DEBUGF("%s: (label=%s, hash=%02x%02x) => %02x%02x\n", __FUNCTION__, label, hash[0], hash[1], ((uint8_t *)secret)[0],
                ((uint8_t *)secret)[1]);
    return ret;
}